

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.h
# Opt level: O1

void __thiscall gvr::Mesh::normalizeNormals(Mesh *this)

{
  float *pfVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  float fVar6;
  
  iVar2 = (this->super_PointCloud).n * 3;
  uVar3 = iVar2 - 3;
  if (-1 < (int)uVar3) {
    uVar5 = iVar2 - 1;
    lVar4 = (ulong)uVar3 + 3;
    do {
      pfVar1 = this->normal;
      uVar3 = uVar5 - 1;
      fVar6 = pfVar1[uVar5] * pfVar1[uVar5] +
              pfVar1[lVar4 + -3] * pfVar1[lVar4 + -3] + pfVar1[uVar3] * pfVar1[uVar3];
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      if (0.0 < fVar6) {
        pfVar1 = this->normal;
        pfVar1[lVar4 + -3] = pfVar1[lVar4 + -3] / fVar6;
        pfVar1[uVar3] = pfVar1[uVar3] / fVar6;
        pfVar1[uVar5] = pfVar1[uVar5] / fVar6;
      }
      uVar5 = uVar5 - 3;
      lVar4 = lVar4 + -3;
    } while (2 < lVar4);
  }
  return;
}

Assistant:

int getVertexCount() const { return n; }